

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m2v.c
# Opt level: O2

m2v * m2v_make(m2v *__return_storage_ptr__,int n_row,int n_col,m2v_base *memory)

{
  __return_storage_ptr__->n_row = n_row;
  __return_storage_ptr__->n_col = n_col;
  __return_storage_ptr__->row_stride = (n_col + 0x1f) / 0x20;
  __return_storage_ptr__->e = memory;
  return __return_storage_ptr__;
}

Assistant:

m2v m2v_make(int n_row, int n_col, m2v_base* memory)
{
	m2v ret;
	ret.n_row = n_row;
	ret.n_col = n_col;

	ret.row_stride = m2v_get_row_size(n_col);
	ret.e = memory;

	return ret;
}